

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# public_util.h
# Opt level: O2

type_conflict
dukglue_pcall_method<int,DukValue,int>(duk_context *ctx,DukValue *obj,char *method_name,int args)

{
  duk_int_t return_code;
  DukErrorException *this;
  int out;
  SafeMethodCallData<int,_DukValue,_int> data;
  
  data.out = &out;
  data.obj = obj;
  data.method_name = method_name;
  data.args.super__Tuple_impl<0UL,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
       (_Tuple_impl<0UL,_int>)(_Tuple_impl<0UL,_int>)args;
  return_code = duk_safe_call(ctx,dukglue::detail::call_method_safe<int,DukValue,int>,&data,0,1);
  if (return_code == 0) {
    duk_pop(ctx);
    return out;
  }
  this = (DukErrorException *)__cxa_allocate_exception(0x28);
  DukErrorException::DukErrorException(this,ctx,return_code,true);
  __cxa_throw(this,&DukErrorException::typeinfo,DukException::~DukException);
}

Assistant:

typename std::enable_if<!std::is_void<RetT>::value, RetT>::type dukglue_pcall_method(duk_context* ctx, const ObjT& obj, const char* method_name, ArgTs... args)
{
	RetT out;
	dukglue::detail::SafeMethodCallData<RetT, ObjT, ArgTs...> data {
		&obj, method_name, std::tuple<ArgTs...>(args...), &out
	};

	duk_idx_t rc = duk_safe_call(ctx, &dukglue::detail::call_method_safe<RetT, ObjT, ArgTs...>, (void*) &data, 0, 1);
	if (rc != 0)
		throw DukErrorException(ctx, rc);

	duk_pop(ctx);  // remove result from stack
	return std::move(out);
}